

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::
ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
::ArrayWithPreallocation
          (ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
           *this,ArrayWithPreallocation<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node::Source,_4UL>
                 *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  
  this->numActive = 0;
  this->numAllocated = 4;
  uVar6 = other->numAllocated;
  if (uVar6 < 5) {
    this->items = (Source *)this->space;
    uVar6 = other->numActive;
    this->numActive = uVar6;
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
      puVar1 = (undefined8 *)((long)&other->items->node + lVar4);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&this->items->node + lVar4);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      uVar6 = this->numActive;
      lVar4 = lVar4 + 0x10;
    }
  }
  else {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar6;
    other->items = (Source *)other->space;
    other->numAllocated = 4;
    other->numActive = 0;
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }